

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

void AudioCallbackWrapper(void *userdata,Uint8 *stream,int len)

{
  int iVar1;
  SDL_bool local_2c;
  SDL_bool must_mix;
  AudioCallbackWrapperData *data;
  int len_local;
  Uint8 *stream_local;
  void *userdata_local;
  
  local_2c = SDL_FALSE;
  if ((*(int *)((long)userdata + 0x20) != 0) &&
     (iVar1 = (*SDL20_AtomicGet)(&audio_callback_paused), iVar1 == 0)) {
    do {
      iVar1 = (*SDL20_AudioStreamAvailable)(*(SDL_AudioStream **)((long)userdata + 0x48));
      if (len <= iVar1) break;
      (*SDL20_memset)(*(void **)((long)userdata + 0x3f58),
                      (int)*(undefined1 *)((long)userdata + 0x2f),
                      (size_t)*(undefined4 *)((long)userdata + 0x34));
      (**(code **)((long)userdata + 0x38))
                (*(undefined8 *)((long)userdata + 0x40),*(undefined8 *)((long)userdata + 0x3f58),
                 *(undefined4 *)((long)userdata + 0x34));
      iVar1 = (*SDL20_AudioStreamPut)
                        (*(SDL_AudioStream **)((long)userdata + 0x48),
                         *(void **)((long)userdata + 0x3f58),*(int *)((long)userdata + 0x34));
    } while (iVar1 != -1);
    iVar1 = (*SDL20_AudioStreamGet)(*(SDL_AudioStream **)((long)userdata + 0x48),stream,len);
    if (iVar1 != len) {
      (*SDL20_memset)(stream,(int)*(undefined1 *)((long)userdata + 7),(long)len);
    }
    local_2c = (SDL_bool)(iVar1 == len);
  }
  FakeCdRomAudioCallback((AudioCallbackWrapperData *)userdata,stream,len,local_2c);
  return;
}

Assistant:

static void SDLCALL
AudioCallbackWrapper(void *userdata, Uint8 *stream, int len)
{
    AudioCallbackWrapperData *data = (AudioCallbackWrapperData *) userdata;
    SDL_bool must_mix = SDL_FALSE;

    if (data->app_callback_opened && !SDL20_AtomicGet(&audio_callback_paused)) {
        while (SDL20_AudioStreamAvailable(data->app_callback_stream) < len) {
            SDL20_memset(data->mix_buffer, data->app_callback_format.silence, data->app_callback_format.size);  /* SDL2 doesn't clear the stream before calling in here, but 1.2 expects it. */
            data->app_callback_format.callback(data->app_callback_format.userdata, data->mix_buffer, data->app_callback_format.size);
            if (SDL20_AudioStreamPut(data->app_callback_stream, data->mix_buffer, data->app_callback_format.size) == -1) {  /* probably out of memory if failed */
                break;  /* this will make the AudioStreamGet call fail. */
            }
        }
        if (SDL20_AudioStreamGet(data->app_callback_stream, stream, len) != len) {
            SDL20_memset(stream, data->device_format.silence, len);
        } else {
            must_mix = SDL_TRUE;
        }
    }

    FakeCdRomAudioCallback(data, stream, len, must_mix);
}